

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_p2sh_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  _Bool _Var1;
  int ret;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((bytes == (uchar *)0x0) || (bytes_len == 0)) || (_Var1 = script_flags_ok(flags,0), !_Var1))
     || ((((flags & 2) != 0 || (bytes_out == (uchar *)0x0)) ||
         ((len < 0x17 || (written == (size_t *)0x0)))))) {
    bytes_local._4_4_ = -2;
  }
  else {
    *bytes_out = 0xa9;
    bytes_local._4_4_ =
         wally_script_push_from_bytes(bytes,bytes_len,flags,bytes_out + 1,len - 2,written);
    if (bytes_local._4_4_ == 0) {
      bytes_out[0x16] = 0x87;
      *written = 0x17;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_p2sh_from_bytes(
    const unsigned char *bytes, size_t bytes_len,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || !script_flags_ok(flags, 0) ||
        (flags & WALLY_SCRIPT_SHA256) || !bytes_out ||
        len < WALLY_SCRIPTPUBKEY_P2SH_LEN || !written)
        return WALLY_EINVAL;

    bytes_out[0] = OP_HASH160;
    ret = wally_script_push_from_bytes(bytes, bytes_len, flags,
                                       bytes_out + 1, len - 2, written);
    if (ret == WALLY_OK) {
        bytes_out[WALLY_SCRIPTPUBKEY_P2SH_LEN - 1] = OP_EQUAL;
        *written = WALLY_SCRIPTPUBKEY_P2SH_LEN;
    }
    return ret;
}